

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::sse2::PointsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,PointsISA *this,mvector<PrimRefMB> *prims,BBox1f *t0t1
          ,range<unsigned_long> *r,size_t k,uint geomID)

{
  RawBufferView *pRVar1;
  float *pfVar2;
  PrimRefMB *pPVar3;
  Vec3fx *pVVar4;
  BBox1f BVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  PrimRefMB *pPVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  LBBox3fx *pLVar13;
  ulong uVar14;
  int iVar15;
  size_t *psVar16;
  undefined4 uVar17;
  uint index;
  float fVar18;
  unsigned_long uVar19;
  size_t itime;
  int iVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  uint uVar34;
  float fVar35;
  uint uVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float local_220;
  float local_21c;
  ulong local_1f0;
  size_t local_1c0;
  size_t local_1b8;
  unsigned_long local_1b0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  BBox1f local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_f0;
  anon_class_16_2_4e716a3c local_e8;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar19 = r->_begin;
  local_158.lower = 0.0;
  local_158.upper = 1.0;
  local_1b0 = 0;
  local_220 = 0.0;
  local_21c = 1.0;
  local_168._8_8_ = 0xff800000ff800000;
  local_168._0_8_ = 0xff800000ff800000;
  local_178._8_8_ = 0x7f8000007f800000;
  local_178._0_8_ = 0x7f8000007f800000;
  local_1f0 = 0;
  local_1b8 = 0;
  local_138._8_8_ = 0xff800000ff800000;
  local_138._0_8_ = 0xff800000ff800000;
  local_188._8_8_ = 0xff800000ff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_148._8_8_ = 0x7f8000007f800000;
  local_148._0_8_ = 0x7f8000007f800000;
  local_198._8_8_ = 0x7f8000007f800000;
  local_198._0_8_ = 0x7f8000007f800000;
  local_1c0 = k;
  while( true ) {
    if (r->_end <= uVar19) {
      (__return_storage_ptr__->object_range)._end = local_1b0;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_198._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_198._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_188._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_188._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_178._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_178._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_168._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_168._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_148._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_148._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_138._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_138._8_8_;
      (__return_storage_ptr__->time_range).lower = local_21c;
      (__return_storage_ptr__->time_range).upper = local_220;
      __return_storage_ptr__->num_time_segments = local_1b8;
      __return_storage_ptr__->max_num_time_segments = local_1f0;
      __return_storage_ptr__->max_time_range = local_158;
      return __return_storage_ptr__;
    }
    BVar5 = (this->super_Points).super_Geometry.time_range;
    fVar30 = BVar5.lower;
    fVar39 = (this->super_Points).super_Geometry.fnumTimeSegments;
    fVar25 = t0t1->lower;
    fVar26 = t0t1->upper;
    fVar33 = BVar5.upper - fVar30;
    fVar22 = ceilf(((fVar26 - fVar30) / fVar33) * 0.99999976 * fVar39);
    fVar18 = (float)uVar19;
    pBVar6 = (this->super_Points).vertices.items;
    if ((uVar19 & 0xffffffff) < (pBVar6->super_RawBufferView).num) break;
LAB_00259a28:
    uVar19 = uVar19 + 1;
  }
  if (fVar39 <= fVar22) {
    fVar22 = fVar39;
  }
  fVar23 = (fVar25 - fVar30) / fVar33;
  fVar24 = floorf(fVar23 * 1.0000002 * fVar39);
  fVar25 = 0.0;
  if (0.0 <= fVar24) {
    fVar25 = fVar24;
  }
  psVar16 = &pBVar6[(int)fVar25].super_RawBufferView.stride;
  uVar14 = (long)(int)fVar25 - 1;
LAB_002599d7:
  uVar14 = uVar14 + 1;
  if ((ulong)(long)(int)fVar22 < uVar14) {
    local_e8.primID = &local_f0;
    fVar33 = (fVar26 - fVar30) / fVar33;
    fVar22 = fVar39 * fVar33;
    local_f0 = uVar19;
    local_e8.this = &this->super_Points;
    fVar25 = floorf(fVar39 * fVar23);
    fVar26 = ceilf(fVar22);
    iVar15 = (int)fVar25;
    if (fVar25 <= 0.0) {
      fVar25 = 0.0;
    }
    fVar30 = fVar26;
    if (fVar39 <= fVar26) {
      fVar30 = fVar39;
    }
    iVar20 = -1;
    if (-1 < iVar15) {
      iVar20 = iVar15;
    }
    iVar12 = (int)fVar39 + 1;
    if ((int)fVar26 < (int)fVar39 + 1) {
      iVar12 = (int)fVar26;
    }
    Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&blower0,&local_e8,(long)(int)fVar25)
    ;
    Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&bupper1,&local_e8,(long)(int)fVar30)
    ;
    fVar26 = fVar39 * fVar23 - fVar25;
    if (iVar12 - iVar20 == 1) {
      if (fVar26 <= 0.0) {
        fVar26 = 0.0;
      }
      fVar39 = 1.0 - fVar26;
      fVar42 = fVar39 * blower0.lower.field_0.m128[0] + fVar26 * bupper1.lower.field_0.m128[0];
      fVar43 = fVar39 * blower0.lower.field_0.m128[1] + fVar26 * bupper1.lower.field_0.m128[1];
      fVar44 = fVar39 * blower0.lower.field_0.m128[2] + fVar26 * bupper1.lower.field_0.m128[2];
      fVar25 = fVar39 * blower0.upper.field_0.m128[0] + fVar26 * bupper1.upper.field_0.m128[0];
      fVar40 = fVar39 * blower0.upper.field_0.m128[1] + fVar26 * bupper1.upper.field_0.m128[1];
      fVar41 = fVar39 * blower0.upper.field_0.m128[2] + fVar26 * bupper1.upper.field_0.m128[2];
      fVar30 = fVar30 - fVar22;
      if (fVar30 <= 0.0) {
        fVar30 = 0.0;
      }
      fVar39 = 1.0 - fVar30;
      fVar46 = bupper1.lower.field_0.m128[0] * fVar39 + blower0.lower.field_0.m128[0] * fVar30;
      fVar47 = bupper1.lower.field_0.m128[1] * fVar39 + blower0.lower.field_0.m128[1] * fVar30;
      fVar48 = bupper1.lower.field_0.m128[2] * fVar39 + blower0.lower.field_0.m128[2] * fVar30;
      fVar22 = fVar39 * bupper1.upper.field_0.m128[0] + fVar30 * blower0.upper.field_0.m128[0];
      fVar37 = fVar39 * bupper1.upper.field_0.m128[1] + fVar30 * blower0.upper.field_0.m128[1];
      fVar38 = fVar39 * bupper1.upper.field_0.m128[2] + fVar30 * blower0.upper.field_0.m128[2];
    }
    else {
      Points::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&blower1,&local_e8,(long)((int)fVar25 + 1));
      Points::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&bupper0,&local_e8,(long)((int)fVar30 + -1));
      if (fVar26 <= 0.0) {
        fVar26 = 0.0;
      }
      fVar24 = 1.0 - fVar26;
      fVar42 = blower0.lower.field_0.m128[0] * fVar24 + blower1.lower.field_0.m128[0] * fVar26;
      fVar43 = blower0.lower.field_0.m128[1] * fVar24 + blower1.lower.field_0.m128[1] * fVar26;
      fVar44 = blower0.lower.field_0.m128[2] * fVar24 + blower1.lower.field_0.m128[2] * fVar26;
      fVar45 = blower0.lower.field_0.m128[3] * fVar24 + blower1.lower.field_0.m128[3] * fVar26;
      fVar25 = fVar24 * blower0.upper.field_0.m128[0] + fVar26 * blower1.upper.field_0.m128[0];
      fVar40 = fVar24 * blower0.upper.field_0.m128[1] + fVar26 * blower1.upper.field_0.m128[1];
      fVar41 = fVar24 * blower0.upper.field_0.m128[2] + fVar26 * blower1.upper.field_0.m128[2];
      fVar26 = fVar24 * blower0.upper.field_0.m128[3] + fVar26 * blower1.upper.field_0.m128[3];
      fVar30 = fVar30 - fVar22;
      if (fVar30 <= 0.0) {
        fVar30 = 0.0;
      }
      fVar24 = 1.0 - fVar30;
      fVar46 = bupper1.lower.field_0.m128[0] * fVar24 + bupper0.lower.field_0.m128[0] * fVar30;
      fVar47 = bupper1.lower.field_0.m128[1] * fVar24 + bupper0.lower.field_0.m128[1] * fVar30;
      fVar48 = bupper1.lower.field_0.m128[2] * fVar24 + bupper0.lower.field_0.m128[2] * fVar30;
      fVar49 = bupper1.lower.field_0.m128[3] * fVar24 + bupper0.lower.field_0.m128[3] * fVar30;
      fVar22 = fVar24 * bupper1.upper.field_0.m128[0] + fVar30 * bupper0.upper.field_0.m128[0];
      fVar37 = fVar24 * bupper1.upper.field_0.m128[1] + fVar30 * bupper0.upper.field_0.m128[1];
      fVar38 = fVar24 * bupper1.upper.field_0.m128[2] + fVar30 * bupper0.upper.field_0.m128[2];
      fVar30 = fVar24 * bupper1.upper.field_0.m128[3] + fVar30 * bupper0.upper.field_0.m128[3];
      if (iVar15 < 0) {
        iVar15 = -1;
      }
      itime = (size_t)iVar15;
      while (itime = itime + 1, (long)itime < (long)iVar12) {
        fVar24 = ((float)(int)itime / fVar39 - fVar23) / (fVar33 - fVar23);
        fVar35 = 1.0 - fVar24;
        Points::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_e8,itime);
        auVar29._0_4_ = bi.lower.field_0.m128[0] - (fVar42 * fVar35 + fVar46 * fVar24);
        auVar29._4_4_ = bi.lower.field_0.m128[1] - (fVar43 * fVar35 + fVar47 * fVar24);
        auVar29._8_4_ = bi.lower.field_0.m128[2] - (fVar44 * fVar35 + fVar48 * fVar24);
        auVar29._12_4_ = bi.lower.field_0.m128[3] - (fVar45 * fVar35 + fVar49 * fVar24);
        auVar32._0_4_ = bi.upper.field_0.m128[0] - (fVar35 * fVar25 + fVar24 * fVar22);
        auVar32._4_4_ = bi.upper.field_0.m128[1] - (fVar35 * fVar40 + fVar24 * fVar37);
        auVar32._8_4_ = bi.upper.field_0.m128[2] - (fVar35 * fVar41 + fVar24 * fVar38);
        auVar32._12_4_ = bi.upper.field_0.m128[3] - (fVar35 * fVar26 + fVar24 * fVar30);
        auVar29 = minps(auVar29,ZEXT816(0));
        auVar32 = maxps(auVar32,ZEXT816(0));
        fVar42 = fVar42 + auVar29._0_4_;
        fVar43 = fVar43 + auVar29._4_4_;
        fVar44 = fVar44 + auVar29._8_4_;
        fVar45 = fVar45 + auVar29._12_4_;
        fVar46 = fVar46 + auVar29._0_4_;
        fVar47 = fVar47 + auVar29._4_4_;
        fVar48 = fVar48 + auVar29._8_4_;
        fVar49 = fVar49 + auVar29._12_4_;
        fVar25 = fVar25 + auVar32._0_4_;
        fVar40 = fVar40 + auVar32._4_4_;
        fVar41 = fVar41 + auVar32._8_4_;
        fVar26 = fVar26 + auVar32._12_4_;
        fVar22 = fVar22 + auVar32._0_4_;
        fVar37 = fVar37 + auVar32._4_4_;
        fVar38 = fVar38 + auVar32._8_4_;
        fVar30 = fVar30 + auVar32._12_4_;
      }
    }
    fVar39 = (float)((this->super_Points).super_Geometry.numTimeSteps - 1);
    uVar14 = (ulong)(uint)fVar39;
    auVar28._0_4_ = fVar25 * 0.5 + fVar22 * 0.5 + fVar42 * 0.5 + fVar46 * 0.5;
    auVar28._4_4_ = fVar40 * 0.5 + fVar37 * 0.5 + fVar43 * 0.5 + fVar47 * 0.5;
    auVar28._8_4_ = fVar41 * 0.5 + fVar38 * 0.5 + fVar44 * 0.5 + fVar48 * 0.5;
    auVar28._12_4_ = fVar18 * 0.5 + fVar39 * 0.5 + (float)geomID * 0.5 + fVar39 * 0.5;
    BVar5 = (this->super_Points).super_Geometry.time_range;
    auVar10._4_4_ = fVar43;
    auVar10._0_4_ = fVar42;
    auVar10._8_4_ = fVar44;
    auVar10._12_4_ = geomID;
    local_198 = minps(local_198,auVar10);
    local_1b0 = local_1b0 + 1;
    local_1b8 = local_1b8 + uVar14;
    bVar21 = local_1f0 < uVar14;
    if (local_1f0 <= uVar14) {
      local_1f0 = uVar14;
    }
    pPVar7 = prims->items;
    pPVar3 = pPVar7 + local_1c0;
    (pPVar3->lbounds).bounds0.lower.field_0.m128[0] = fVar42;
    (pPVar3->lbounds).bounds0.lower.field_0.m128[1] = fVar43;
    (pPVar3->lbounds).bounds0.lower.field_0.m128[2] = fVar44;
    (pPVar3->lbounds).bounds0.lower.field_0.m128[3] = (float)geomID;
    auVar9._4_4_ = fVar40;
    auVar9._0_4_ = fVar25;
    auVar9._8_4_ = fVar41;
    auVar9._12_4_ = fVar18;
    local_188 = maxps(local_188,auVar9);
    pVVar4 = &pPVar7[local_1c0].lbounds.bounds0.upper;
    (pVVar4->field_0).m128[0] = fVar25;
    (pVVar4->field_0).m128[1] = fVar40;
    (pVVar4->field_0).m128[2] = fVar41;
    (pVVar4->field_0).m128[3] = fVar18;
    auVar11._4_4_ = fVar47;
    auVar11._0_4_ = fVar46;
    auVar11._8_4_ = fVar48;
    auVar11._12_4_ = fVar39;
    local_178 = minps(local_178,auVar11);
    pLVar13 = &pPVar7[local_1c0].lbounds;
    (pLVar13->bounds1).lower.field_0.m128[0] = fVar46;
    (pLVar13->bounds1).lower.field_0.m128[1] = fVar47;
    (pLVar13->bounds1).lower.field_0.m128[2] = fVar48;
    (pLVar13->bounds1).lower.field_0.m128[3] = fVar39;
    auVar8._4_4_ = fVar37;
    auVar8._0_4_ = fVar22;
    auVar8._8_4_ = fVar38;
    auVar8._12_4_ = fVar39;
    local_168 = maxps(local_168,auVar8);
    pVVar4 = &pPVar7[local_1c0].lbounds.bounds1.upper;
    (pVVar4->field_0).m128[0] = fVar22;
    (pVVar4->field_0).m128[1] = fVar37;
    (pVVar4->field_0).m128[2] = fVar38;
    (pVVar4->field_0).m128[3] = fVar39;
    pPVar7[local_1c0].time_range = BVar5;
    local_148 = minps(local_148,auVar28);
    local_138 = maxps(local_138,auVar28);
    fVar39 = BVar5.lower;
    if (fVar39 <= local_21c) {
      local_21c = fVar39;
    }
    fVar26 = BVar5.upper;
    fVar25 = fVar26;
    if (fVar26 <= local_220) {
      fVar25 = local_220;
    }
    uVar34 = (int)((uint)bVar21 << 0x1f) >> 0x1f;
    uVar36 = (int)((uint)bVar21 << 0x1f) >> 0x1f;
    local_1c0 = local_1c0 + 1;
    local_158.upper = (float)(~uVar36 & (uint)local_158.upper | (uint)fVar26 & uVar36);
    local_158.lower = (float)(~uVar34 & (uint)local_158.lower | (uint)fVar39 & uVar34);
    local_220 = fVar25;
  }
  else {
    pRVar1 = (RawBufferView *)(psVar16 + -2);
    pfVar2 = (float *)(pRVar1->ptr_ofs + *psVar16 * (uVar19 & 0xffffffff));
    fVar25 = pfVar2[3];
    auVar27._4_4_ = -(uint)(pfVar2[1] <= -1.844e+18);
    auVar27._0_4_ = -(uint)(*pfVar2 <= -1.844e+18);
    auVar27._8_4_ = -(uint)(pfVar2[2] <= -1.844e+18);
    auVar27._12_4_ = -(uint)(fVar25 <= -1.844e+18);
    auVar31._4_4_ = -(uint)(1.844e+18 <= pfVar2[1]);
    auVar31._0_4_ = -(uint)(1.844e+18 <= *pfVar2);
    auVar31._8_4_ = -(uint)(1.844e+18 <= pfVar2[2]);
    auVar31._12_4_ = -(uint)(1.844e+18 <= fVar25);
    if (0.0 <= fVar25) goto code_r0x00259a0d;
  }
  goto LAB_00259a28;
code_r0x00259a0d:
  psVar16 = psVar16 + 7;
  uVar17 = movmskps((int)pRVar1->ptr_ofs,auVar27 | auVar31);
  if ((char)uVar17 != '\0') goto LAB_00259a28;
  goto LAB_002599d7;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims,
                                      const BBox1f& t0t1,
                                      const range<size_t>& r,
                                      size_t k,
                                      unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          if (!valid(j, timeSegmentRange(t0t1)))
            continue;
          const PrimRefMB prim(linearBounds(j, t0t1), this->numTimeSegments(), this->time_range, this->numTimeSegments(), geomID, unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }